

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

SHMPTR SHMFindNamedObjectByName(LPCWSTR lpName,SHM_NAMED_OBJECTS_ID oid,BOOL *pbNameExists)

{
  int iVar1;
  SHM_NAMED_OBJECTS_ID *pSVar2;
  char16_t *local_40;
  LPWSTR object_name;
  SHMPTR shmNamedObject;
  PSHM_NAMED_OBJECTS pNamedObject;
  BOOL *pbNameExists_local;
  SHM_NAMED_OBJECTS_ID oid_local;
  LPCWSTR lpName_local;
  
  local_40 = (char16_t *)0x0;
  if (oid == SHM_NAMED_LAST) {
    fprintf(_stderr,"] %s %s:%d","SHMFindNamedObjectByName",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x55b);
    fprintf(_stderr,"Invalid named object type.\n");
    lpName_local = (LPCWSTR)0x0;
  }
  else {
    if (pbNameExists == (BOOL *)0x0) {
      fprintf(_stderr,"] %s %s:%d","SHMFindNamedObjectByName",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
              ,0x561);
      fprintf(_stderr,"pbNameExists must be non-NULL.\n");
    }
    SHMLock();
    *pbNameExists = 0;
    object_name = (LPWSTR)SHMGetInfo(SIID_NAMED_OBJECTS);
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    while (object_name != (LPWSTR)0x0) {
      pSVar2 = (SHM_NAMED_OBJECTS_ID *)SHMPtrToPtr((SHMPTR)object_name);
      if (pSVar2 == (SHM_NAMED_OBJECTS_ID *)0x0) {
        fprintf(_stderr,"] %s %s:%d","SHMFindNamedObjectByName",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
                ,0x572);
        fprintf(_stderr,"Got invalid SHMPTR value; list of named objects is corrupted.\n");
        break;
      }
      if (*(undefined8 *)(pSVar2 + 4) != SHM_NAMED_MAPPINGS) {
        local_40 = (char16_t *)SHMPtrToPtr(*(undefined8 *)(pSVar2 + 4));
      }
      if ((local_40 != (char16_t *)0x0) && (iVar1 = PAL_wcscmp(lpName,local_40), iVar1 == 0)) {
        if (oid == *pSVar2) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
        }
        else {
          object_name = (LPWSTR)0x0;
          *pbNameExists = 1;
        }
        goto LAB_0024946f;
      }
      object_name = *(LPWSTR *)(pSVar2 + 2);
    }
    object_name = (LPWSTR)0x0;
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
LAB_0024946f:
    SHMRelease();
    lpName_local = object_name;
  }
  return (SHMPTR)lpName_local;
}

Assistant:

SHMPTR SHMFindNamedObjectByName( LPCWSTR lpName, SHM_NAMED_OBJECTS_ID oid,
                                 BOOL *pbNameExists )
{
    PSHM_NAMED_OBJECTS pNamedObject = NULL;
    SHMPTR shmNamedObject = 0;
    LPWSTR object_name = NULL;

    if(oid==SHM_NAMED_LAST)
    {
        ASSERT("Invalid named object type.\n");
        return 0;
    }

    if (pbNameExists == NULL)
    {
        ASSERT("pbNameExists must be non-NULL.\n");
    }

    SHMLock();

    *pbNameExists = FALSE;
    shmNamedObject = SHMGetInfo( SIID_NAMED_OBJECTS );

    TRACE( "Entering SHMFindNamedObjectByName looking for %S .\n",
           lpName?lpName:W16_NULLSTRING );

    while ( shmNamedObject )
    {
        pNamedObject = (PSHM_NAMED_OBJECTS)SHMPTR_TO_PTR( shmNamedObject );
        if(NULL == pNamedObject)
        {
            ASSERT("Got invalid SHMPTR value; list of named objects is "
                   "corrupted.\n");
            break;
        }

        if ( pNamedObject->ShmObjectName )
        {
            object_name = (LPWSTR)SHMPTR_TO_PTR( pNamedObject->ShmObjectName );
        }

        if ( object_name &&
             PAL_wcscmp( lpName, object_name ) == 0 )
        {
            if(oid == pNamedObject->ObjectType)
            {
                TRACE( "Returning the kernel object %p.\n", pNamedObject );
            }
            else
            {
                shmNamedObject = 0;
                *pbNameExists = TRUE;
            }
            goto Exit;
        }
        shmNamedObject = pNamedObject->ShmNext;
    }

    shmNamedObject = 0;
    TRACE( "No matching kernel object was found.\n" );

Exit:
    SHMRelease();
    return shmNamedObject;

}